

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
processTriangle(LocalTriangleSphereCastCallback *this,btVector3 *triangle,int partId,
               int triangleIndex)

{
  btScalar bVar1;
  bool bVar2;
  btSubsimplexConvexCast convexCaster;
  btTransform ident;
  btSphereShape pointShape;
  btTriangleShape triShape;
  btVoronoiSimplexSolver simplexSolver;
  btSubsimplexConvexCast local_368;
  btTransform local_348;
  btConvexInternalShape local_308;
  btPolyhedralConvexShape local_2c0;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  CastResult local_240;
  btVoronoiSimplexSolver local_180;
  
  local_348.m_basis.m_el[0].m_floats[0] = 1.0;
  local_348.m_basis.m_el[0].m_floats[1] = 0.0;
  local_348.m_basis.m_el[0].m_floats[2] = 0.0;
  local_348.m_basis.m_el[0].m_floats[3] = 0.0;
  local_348.m_basis.m_el[1].m_floats[0] = 0.0;
  local_348.m_basis.m_el[1].m_floats[1] = 1.0;
  local_348.m_basis.m_el[1].m_floats[2] = 0.0;
  local_348.m_basis.m_el[1].m_floats[3] = 0.0;
  local_348.m_basis.m_el[2].m_floats[0] = 0.0;
  local_348.m_basis.m_el[2].m_floats[1] = 0.0;
  local_348.m_basis.m_el[2].m_floats[2] = 1.0;
  local_348.m_basis.m_el[2].m_floats[3] = 0.0;
  local_348.m_origin.m_floats[0] = 0.0;
  local_348.m_origin.m_floats[1] = 0.0;
  local_348.m_origin.m_floats[2] = 0.0;
  local_348.m_origin.m_floats[3] = 0.0;
  local_240._vptr_CastResult = (_func_int **)&PTR_DebugDraw_0021bc78;
  local_240.m_debugDrawer = (btIDebugDraw *)0x0;
  local_240.m_allowedPenetration = 0.0;
  local_240.m_fraction = this->m_hitFraction;
  bVar1 = this->m_ccdSphereRadius;
  btConvexInternalShape::btConvexInternalShape(&local_308);
  local_308.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btConvexShape_0021e930;
  local_308.super_btConvexShape.super_btCollisionShape.m_shapeType = 8;
  local_308.m_implicitShapeDimensions.m_floats[0] = bVar1;
  local_308.m_collisionMargin = bVar1;
  btPolyhedralConvexShape::btPolyhedralConvexShape(&local_2c0);
  local_2c0.super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btPolyhedralConvexShape_0021c238;
  local_2c0.super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_shapeType = 1;
  local_270 = *(undefined8 *)triangle->m_floats;
  uStack_268 = *(undefined8 *)(triangle->m_floats + 2);
  local_260 = *(undefined8 *)triangle[1].m_floats;
  uStack_258 = *(undefined8 *)(triangle[1].m_floats + 2);
  local_250 = *(undefined8 *)triangle[2].m_floats;
  uStack_248 = *(undefined8 *)(triangle[2].m_floats + 2);
  local_180.m_equalVertexThreshold = 0.0001;
  local_180.m_cachedBC.m_usedVertices._0_1_ = 0;
  btSubsimplexConvexCast::btSubsimplexConvexCast
            (&local_368,&local_308.super_btConvexShape,(btConvexShape *)&local_2c0,&local_180);
  bVar2 = btSubsimplexConvexCast::calcTimeOfImpact
                    (&local_368,&this->m_ccdSphereFromTrans,&this->m_ccdSphereToTrans,&local_348,
                     &local_348,&local_240);
  if ((bVar2) && (local_240.m_fraction < this->m_hitFraction)) {
    this->m_hitFraction = local_240.m_fraction;
  }
  btConvexCast::~btConvexCast(&local_368.super_btConvexCast);
  btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_2c0);
  btConvexShape::~btConvexShape(&local_308.super_btConvexShape);
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}